

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O1

int ecc_config_get(igsc_device_handle *handle)

{
  FILE *__stream;
  uint uVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined8 uVar4;
  int iVar5;
  long in_FS_OFFSET;
  uint8_t pen_ecc_state;
  uint8_t cur_ecc_state;
  byte local_32;
  byte local_31;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_31 = 0xff;
  local_32 = 0xff;
  iVar5 = 3;
  do {
    uVar1 = igsc_ecc_config_get(handle,&local_31,&local_32);
    if (uVar1 != 0xd) break;
    usleep(2000000);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  if (uVar1 == 0) {
    if (quiet == '\0') {
      fprintf(_stdout,"Current ECC State: %u\n",(ulong)local_31);
    }
    if (quiet == '\0') {
      fprintf(_stdout,"Pending ECC State: %u\n",(ulong)local_32);
    }
  }
  else {
    if (quiet == '\0') {
      fprintf(_stderr,"Error: Failed to get ECC config, return code %d\n",(ulong)uVar1);
    }
    __stream = _stdout;
    if (quiet == '\0') {
      uVar2 = igsc_get_last_firmware_status(handle);
      uVar4 = igsc_translate_firmware_status(uVar2);
      uVar3 = igsc_get_last_firmware_status(handle);
      fprintf(__stream,"Firmware status: %s (0x%x)\n",uVar4,(ulong)uVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

mockable_static
int ecc_config_get(struct igsc_device_handle *handle)
{
    int     ret;
    uint8_t cur_ecc_state = 0xFF;
    uint8_t pen_ecc_state = 0xFF;
    unsigned int retries = 0;

    while ((ret = igsc_ecc_config_get(handle, &cur_ecc_state, &pen_ecc_state)) == IGSC_ERROR_BUSY)
    {
        gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
        if (++retries >= MAX_CONNECT_RETRIES)
            break;
    }
    if (ret)
    {
        fwupd_error("Failed to get ECC config, return code %d\n", ret);
        print_device_fw_status(handle);
    }
    else
    {
	    fwupd_msg("Current ECC State: %u\n", cur_ecc_state);
	    fwupd_msg("Pending ECC State: %u\n", pen_ecc_state);
    }
    return ret;
}